

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_text_wrap_colored(nk_context *ctx,char *str,int len,nk_color color)

{
  nk_window *pnVar1;
  nk_user_font *font;
  char *pcVar2;
  int len_00;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  nk_rect b;
  int glyphs;
  float width;
  nk_rect bounds;
  int local_d8;
  float local_d4;
  char *local_d0;
  float local_c8;
  float fStack_c4;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  nk_rect local_a8;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  nk_text local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  nk_rect local_40;
  
  local_d0 = str;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4ad0,
                  "void nk_text_wrap_colored(struct nk_context *, const char *, int, struct nk_color)"
                 );
  }
  pnVar1 = ctx->current;
  if (pnVar1 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4ad1,
                  "void nk_text_wrap_colored(struct nk_context *, const char *, int, struct nk_color)"
                 );
  }
  if (pnVar1->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4ad2,
                  "void nk_text_wrap_colored(struct nk_context *, const char *, int, struct nk_color)"
                 );
  }
  nk_panel_alloc_space(&local_40,ctx);
  fVar5 = (ctx->style).text.padding.x;
  _local_98 = ZEXT416((uint)fVar5);
  fVar6 = (ctx->style).text.padding.y;
  local_88.background = (ctx->style).window.background;
  font = (ctx->style).font;
  local_a8.x = local_40.x;
  local_a8.y = local_40.y;
  local_a8.w = 0.0;
  local_a8.h = 0.0;
  local_d8 = 0;
  local_88.padding.x = 0.0;
  local_88.padding.y = 0.0;
  fVar5 = fVar5 + fVar5;
  local_c8 = local_40.w;
  fStack_c4 = local_40.h;
  uStack_c0 = 0;
  fVar4 = fVar5;
  if (fVar5 <= local_40.w) {
    fVar4 = local_40.w;
  }
  local_b8 = ZEXT416((uint)fVar6);
  fVar6 = fVar6 + fVar6;
  local_68 = ZEXT416((uint)(font->height + fVar6));
  local_78 = ZEXT416((uint)(fVar4 - fVar5));
  local_88.text = color;
  len_00 = nk_text_clamp(font,local_d0,len,fVar4 - fVar5,&local_d8,&local_d4,
                         &nk_widget_text_wrap_seperator,1);
  if ((0 < len) && (len_00 != 0)) {
    local_58 = local_78._0_4_;
    uStack_54 = local_68._0_4_;
    uStack_50 = local_78._4_4_;
    uStack_4c = local_68._4_4_;
    local_98._0_4_ = (float)local_98._0_4_ + local_a8.x;
    local_a8.x = (float)local_b8._0_4_ + local_a8.y;
    fVar5 = fVar6;
    if (fVar6 <= fStack_c4) {
      fVar5 = fStack_c4;
    }
    _local_c8 = CONCAT44(fStack_c4,(fVar5 - fVar6) + local_a8.y);
    iVar3 = 0;
    uStack_90 = local_98._4_4_;
    uStack_8c = local_b8._4_4_;
    while( true ) {
      pcVar2 = local_d0;
      if (local_c8 <= (float)local_68._0_4_ + local_a8.x) break;
      local_98._4_4_ = local_a8.x;
      b.h = (float)uStack_54;
      b.w = (float)local_58;
      local_a8.y = local_a8.x;
      local_a8.h = local_a8.x;
      local_a8.w = local_a8.x;
      b.y = local_a8.x;
      b.x = (float)local_98._0_4_;
      nk_widget_text(&pnVar1->buffer,b,local_d0 + iVar3,len_00,&local_88,0x11,font);
      iVar3 = iVar3 + len_00;
      local_b8._0_4_ = font->height + fVar6;
      len_00 = nk_text_clamp(font,pcVar2 + iVar3,len - iVar3,(float)local_78._0_4_,&local_d8,
                             &local_d4,&nk_widget_text_wrap_seperator,1);
      if (len <= iVar3) {
        return;
      }
      local_a8.x = local_a8.x + (float)local_b8._0_4_;
      if (len_00 == 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_text_wrap_colored(struct nk_context *ctx, const char *str,
    int len, struct nk_color color)
{
    struct nk_window *win;
    const struct nk_style *style;

    struct nk_vec2 item_padding;
    struct nk_rect bounds;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout) return;

    win = ctx->current;
    style = &ctx->style;
    nk_panel_alloc_space(&bounds, ctx);
    item_padding = style->text.padding;

    text.padding.x = item_padding.x;
    text.padding.y = item_padding.y;
    text.background = style->window.background;
    text.text = color;
    nk_widget_text_wrap(&win->buffer, bounds, str, len, &text, style->font);
}